

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O1

void synchronize(void)

{
  int iVar1;
  undefined8 *extraout_RDX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t uStack_68;
  code *pcStack_58;
  long lStack_50;
  long lStack_48;
  sockaddr_in sStack_40;
  uv_cond_t *puStack_30;
  long local_28;
  long local_20;
  
  step = step + 1;
  puStack_30 = (uv_cond_t *)0x1aaf03;
  uv_cond_signal(&condvar);
  iVar1 = step;
  local_28 = (long)step;
  do {
    puStack_30 = (uv_cond_t *)0x1aaf1c;
    uv_cond_wait(&condvar,&mutex);
    local_20 = (long)step;
  } while (iVar1 == step);
  local_28 = local_28 + 1;
  if (local_20 == local_28) {
    return;
  }
  puStack_30 = (uv_cond_t *)0x1aaf56;
  synchronize_cold_1();
  puStack_30 = &condvar;
  iVar2 = (int)&lStack_50;
  pcStack_58 = (code *)0x1aaf73;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_40);
  lStack_48 = (long)iVar1;
  lStack_50 = 0;
  if (lStack_48 == 0) {
    pcStack_58 = (code *)0x1aaf9d;
    iVar1 = uv_loop_init(&loop);
    lStack_48 = (long)iVar1;
    lStack_50 = 0;
    if (lStack_48 != 0) goto LAB_001ab143;
    pcStack_58 = (code *)0x1aafce;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    lStack_48 = (long)iVar1;
    lStack_50 = 0;
    if (lStack_48 != 0) goto LAB_001ab150;
    pcStack_58 = (code *)0x1ab00b;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,(sockaddr *)&sStack_40,connect_cb);
    lStack_48 = (long)iVar1;
    lStack_50 = 0;
    if (lStack_48 != 0) goto LAB_001ab15d;
    pcStack_58 = (code *)0x1ab037;
    iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
    lStack_48 = (long)iVar1;
    lStack_50 = 0;
    if (lStack_48 != 0) goto LAB_001ab16a;
    lStack_48 = 1;
    lStack_50 = (long)connect_cb_called;
    if (lStack_50 != 1) goto LAB_001ab177;
    lStack_48 = 1;
    lStack_50 = (long)read_cb_called;
    if (lStack_50 != 1) goto LAB_001ab184;
    lStack_48 = 1;
    lStack_50 = (long)write_cb_called;
    if (lStack_50 != 1) goto LAB_001ab191;
    lStack_48 = 1;
    lStack_50 = (long)close_cb_called;
    if (lStack_50 != 1) goto LAB_001ab19e;
    pcStack_58 = (code *)0x1ab0f9;
    uv_walk(&loop,close_walk_cb,(void *)0x0);
    pcStack_58 = (code *)0x1ab103;
    uv_run(&loop,UV_RUN_DEFAULT);
    lStack_48 = 0;
    pcStack_58 = (code *)0x1ab114;
    iVar1 = uv_loop_close(&loop);
    lStack_50 = (long)iVar1;
    if (lStack_48 == lStack_50) {
      pcStack_58 = (code *)0x1ab12e;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_58 = (code *)0x1ab143;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001ab143:
    pcStack_58 = (code *)0x1ab150;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001ab150:
    pcStack_58 = (code *)0x1ab15d;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001ab15d:
    pcStack_58 = (code *)0x1ab16a;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001ab16a:
    pcStack_58 = (code *)0x1ab177;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001ab177:
    pcStack_58 = (code *)0x1ab184;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001ab184:
    pcStack_58 = (code *)0x1ab191;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001ab191:
    pcStack_58 = (code *)0x1ab19e;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001ab19e:
    pcStack_58 = (code *)0x1ab1ab;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  pcStack_58 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  uStack_68.base = (char *)(long)iVar2;
  if ((char *)(long)iVar2 == (char *)0x0) {
    iVar1 = uv_read_start((uv_stream_t *)&tcp_client,alloc_cb,read_cb);
    uStack_68.base = (char *)(long)iVar1;
    if ((char *)(long)iVar1 == (char *)0x0) {
      uStack_68 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_client,&uStack_68,1,write_cb);
      pcStack_58 = (code *)0x0;
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001ab297;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001ab297:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return;
}

Assistant:

static void synchronize(void) {
  int current;

  synchronize_nowait();
  /* Wait for the other thread.  Guard against spurious wakeups. */
  for (current = step; current == step; uv_cond_wait(&condvar, &mutex));
  ASSERT_EQ(step, current + 1);
}